

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void recursive_clone(CHAR_DATA *ch,OBJ_DATA *obj,OBJ_DATA *clone)

{
  OBJ_DATA *obj_00;
  bool bVar1;
  OBJ_DATA *clone_00;
  
  for (obj_00 = obj->contains; obj_00 != (OBJ_DATA *)0x0; obj_00 = obj_00->next_content) {
    bVar1 = obj_check(ch,obj_00);
    if (bVar1) {
      clone_00 = create_object(obj_00->pIndexData,0);
      clone_object(obj_00,clone_00);
      obj_to_obj(clone_00,clone);
      recursive_clone(ch,obj_00,clone_00);
    }
  }
  return;
}

Assistant:

void recursive_clone(CHAR_DATA *ch, OBJ_DATA *obj, OBJ_DATA *clone)
{
	OBJ_DATA *t_obj;

	for (OBJ_DATA *c_obj = obj->contains; c_obj != nullptr; c_obj = c_obj->next_content)
	{
		if (obj_check(ch, c_obj))
		{
			t_obj = create_object(c_obj->pIndexData, 0);
			clone_object(c_obj, t_obj);
			obj_to_obj(t_obj, clone);
			recursive_clone(ch, c_obj, t_obj);
		}
	}
}